

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

bool __thiscall SGParser::Generator::Lex::MakeDFAUsingSyntaxTree(Lex *this,DFAGen *dfa)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  pointer ppVar4;
  DFASyntaxTree<SGParser::Generator::RegExprDFANode> *this_00;
  mapped_type *ppDVar5;
  allocator<char> local_229;
  String local_228;
  allocator<char> local_201;
  String local_200;
  allocator<char> local_1d9;
  String local_1d8;
  uint local_1b4;
  undefined1 local_1b0 [4];
  uint r;
  DFAGen testdfa;
  undefined1 local_f0 [8];
  String expr;
  DFASyntaxTree<SGParser::Generator::RegExprDFANode> syntaxTree;
  DFASyntaxTree<SGParser::Generator::RegExprDFANode> *ptree;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *regExp;
  _Self local_78;
  iterator iter;
  String *name;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
  macroSyntaxTrees;
  DFAGen *dfa_local;
  Lex *this_local;
  
  macroSyntaxTrees._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)dfa;
  bVar1 = DFA::IsValid(&dfa->super_DFA);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
           *)&__range2);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->MacroNames);
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size(&this->Macros);
    if (sVar2 != sVar3) {
      __assert_fail("MacroNames.size() == Macros.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                    ,0x523,"bool SGParser::Generator::Lex::MakeDFAUsingSyntaxTree(DFAGen &)");
    }
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->MacroNames);
    name = (String *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->MacroNames);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&name), bVar1) {
      iter._M_node = (_Base_ptr)
                     __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&__end2);
      local_78._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this->Macros,(key_type *)iter._M_node);
      regExp = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end(&this->Macros);
      bVar1 = std::operator!=(&local_78,(_Self *)&regExp);
      if (!bVar1) {
        __assert_fail("iter != Macros.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                      ,0x526,"bool SGParser::Generator::Lex::MakeDFAUsingSyntaxTree(DFAGen &)");
      }
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_78);
      this_00 = (DFASyntaxTree<SGParser::Generator::RegExprDFANode> *)operator_new(0x28);
      DFASyntaxTree<SGParser::Generator::RegExprDFANode>::DFASyntaxTree(this_00);
      bVar1 = MakeSyntaxTree<SGParser::Generator::RegExprDFANode>
                        (this,this_00,&ppVar4->second,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                          *)&__range2);
      if (bVar1) {
        ppDVar5 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                                *)&__range2,(key_type *)iter._M_node);
        *ppDVar5 = this_00;
      }
      else if (this_00 != (DFASyntaxTree<SGParser::Generator::RegExprDFANode> *)0x0) {
        DFASyntaxTree<SGParser::Generator::RegExprDFANode>::~DFASyntaxTree(this_00);
        operator_delete(this_00,0x28);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    sVar2 = std::vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>::size(&this->Lexemes);
    if ((sVar2 != 0) &&
       (sVar2 = std::
                vector<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
                ::size(&this->Expressions), sVar2 == 0)) {
      syntaxTree.CharNodes.
      super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      sVar2 = std::vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>::size(&this->Lexemes)
      ;
      syntaxTree.CharNodes.
      super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)sVar2;
      std::
      vector<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
      ::push_back(&this->Expressions,
                  (value_type *)
                  &syntaxTree.CharNodes.
                   super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    DFASyntaxTree<SGParser::Generator::RegExprDFANode>::DFASyntaxTree
              ((DFASyntaxTree<SGParser::Generator::RegExprDFANode> *)((long)&expr.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f0,"(a|b)*(abb)+c",
               (allocator<char> *)((long)&testdfa.EmptyStateCount + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&testdfa.EmptyStateCount + 7));
    MakeSyntaxTree<SGParser::Generator::RegExprDFANode>
              (this,(DFASyntaxTree<SGParser::Generator::RegExprDFANode> *)((long)&expr.field_2 + 8),
               (String *)local_f0,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
                *)&__range2);
    DFAGen::DFAGen((DFAGen *)local_1b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"aab",&local_1d9);
    local_1b4 = DFAGen::TestString((DFAGen *)local_1b0,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"abbbababb",&local_201);
    local_1b4 = DFAGen::TestString((DFAGen *)local_1b0,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"abb",&local_229);
    local_1b4 = DFAGen::TestString((DFAGen *)local_1b0,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator(&local_229);
    this_local._7_1_ = true;
    DFAGen::~DFAGen((DFAGen *)local_1b0);
    std::__cxx11::string::~string((string *)local_f0);
    DFASyntaxTree<SGParser::Generator::RegExprDFANode>::~DFASyntaxTree
              ((DFASyntaxTree<SGParser::Generator::RegExprDFANode> *)((long)&expr.field_2 + 8));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
            *)&__range2);
  }
  return this_local._7_1_;
}

Assistant:

bool Lex::MakeDFAUsingSyntaxTree(DFAGen& dfa) {
    if (dfa.IsValid())
        return false;

    // Go through all macros (in declaration-order) and create DFASyntaxTree's for them.
    // ("In declaration-order" so a lexically-later macro can refer to a lexically-earlier macro.)
    std::map<String, DFASyntaxTree<RegExprDFANode>*> macroSyntaxTrees;
    SG_ASSERT(MacroNames.size() == Macros.size());
    for (const String& name : MacroNames) {
        auto const iter = Macros.find(name);
        SG_ASSERT(iter != Macros.end());
        auto const& regExp = iter->second;

        // Create a new syntax tree
        const auto ptree = new DFASyntaxTree<RegExprDFANode>;

        // if the nfa failed to initialize then quite
        if (MakeSyntaxTree(*ptree, regExp, macroSyntaxTrees))
            macroSyntaxTrees[name] = ptree;
        else
            delete ptree; // Should we report an error?
    }

    // If there are lexemes, but not a single expression
    // make an expression for them (special case)
    if (Lexemes.size() && !Expressions.size())
        Expressions.push_back({0u, unsigned(Lexemes.size())});

    DFASyntaxTree<RegExprDFANode> syntaxTree;
    const String expr = "(a|b)*(abb)+c";

    MakeSyntaxTree(syntaxTree, expr, macroSyntaxTrees);

    const DFAGen testdfa;

    [[maybe_unused]] unsigned r;
    r = testdfa.TestString("aab");
    r = testdfa.TestString("abbbababb");
    r = testdfa.TestString("abb");

    return true;
}